

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t fmt::v7::detail::count_code_points(basic_string_view<char> s)

{
  char *pcVar1;
  size_t sVar2;
  size_t size;
  size_t i;
  size_t num_code_points;
  char *data;
  size_t local_28;
  size_t local_20;
  basic_string_view<char> local_10;
  
  pcVar1 = basic_string_view<char>::data(&local_10);
  local_20 = 0;
  local_28 = 0;
  sVar2 = basic_string_view<char>::size(&local_10);
  for (; local_28 != sVar2; local_28 = local_28 + 1) {
    if (((int)pcVar1[local_28] & 0xc0U) != 0x80) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

inline size_t count_code_points(basic_string_view<char> s) {
  const char* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80) ++num_code_points;
  }
  return num_code_points;
}